

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapistd.c
# Opt level: O0

void jpeg_start_compress(j_compress_ptr cinfo,boolean write_all_tables)

{
  int iVar1;
  int in_ESI;
  j_compress_ptr in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI->global_state != 100) {
    in_RDI->err->msg_code = 0x15;
    (in_RDI->err->msg_parm).i[0] = in_RDI->global_state;
    (*in_RDI->err->error_exit)((j_common_ptr)in_RDI);
  }
  if (in_ESI != 0) {
    jpeg_suppress_tables(in_RDI,0);
  }
  (*in_RDI->err->reset_error_mgr)((j_common_ptr)in_RDI);
  (*in_RDI->dest->init_destination)(in_RDI);
  jinit_compress_master((j_compress_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  (*in_RDI->master->prepare_for_pass)(in_RDI);
  in_RDI->next_scanline = 0;
  iVar1 = 0x65;
  if (in_RDI->raw_data_in != 0) {
    iVar1 = 0x66;
  }
  in_RDI->global_state = iVar1;
  return;
}

Assistant:

GLOBAL(void)
jpeg_start_compress (j_compress_ptr cinfo, boolean write_all_tables)
{
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  if (write_all_tables)
    jpeg_suppress_tables(cinfo, FALSE);	/* mark all tables to be written */

  /* (Re)initialize error mgr and destination modules */
  (*cinfo->err->reset_error_mgr) ((j_common_ptr) cinfo);
  (*cinfo->dest->init_destination) (cinfo);
  /* Perform master selection of active modules */
  jinit_compress_master(cinfo);
  /* Set up for the first pass */
  (*cinfo->master->prepare_for_pass) (cinfo);
  /* Ready for application to drive first pass through jpeg_write_scanlines
   * or jpeg_write_raw_data.
   */
  cinfo->next_scanline = 0;
  cinfo->global_state = (cinfo->raw_data_in ? CSTATE_RAW_OK : CSTATE_SCANNING);
}